

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derive_key.cc
# Opt level: O2

int EVP_BytesToKey(EVP_CIPHER *type,EVP_MD *md,uchar *salt,uchar *data,int datal,int count,
                  uchar *key,uchar *iv)

{
  ulong uVar1;
  uchar *d;
  size_t cnt;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *__assertion;
  undefined4 in_register_00000084;
  uint uVar6;
  uint mds;
  ulong local_e8;
  int local_dc;
  uint8_t *local_d8;
  uint8_t *local_d0;
  uint local_c4;
  uchar *local_c0;
  size_t local_b8;
  EVP_MD *local_b0;
  EVP_CIPHER *local_a8;
  uchar *local_a0;
  uint8_t md_buf [64];
  ScopedEVP_MD_CTX c;
  
  mds = 0;
  local_c4 = count;
  local_b0 = md;
  local_a0 = salt;
  uVar2 = EVP_CIPHER_key_length(type);
  uVar3 = EVP_CIPHER_iv_length(type);
  if (uVar2 < 0x41) {
    if (uVar3 < 0x11) {
      if (data != (uchar *)0x0) {
        local_d8 = iv;
        local_d0 = key;
        local_e8 = (ulong)uVar2;
        local_a8 = type;
        EVP_MD_CTX_init((EVP_MD_CTX *)&c);
        local_dc = 0;
        local_c0 = data;
        local_b8 = CONCAT44(in_register_00000084,datal);
        do {
          cnt = local_b8;
          d = local_c0;
          iVar4 = EVP_DigestInit_ex((EVP_MD_CTX *)&c,local_b0,(ENGINE *)0x0);
          if (((iVar4 == 0) ||
              ((((local_dc != 0 &&
                 (iVar4 = EVP_DigestUpdate((EVP_MD_CTX *)&c,md_buf,(ulong)mds), iVar4 == 0)) ||
                (iVar4 = EVP_DigestUpdate((EVP_MD_CTX *)&c,d,cnt), iVar4 == 0)) ||
               ((local_a0 != (uchar *)0x0 &&
                (iVar4 = EVP_DigestUpdate((EVP_MD_CTX *)&c,local_a0,8), iVar4 == 0)))))) ||
             (iVar4 = EVP_DigestFinal_ex((EVP_MD_CTX *)&c,md_buf,&mds), iVar4 == 0)) {
            uVar2 = 0;
            goto LAB_001f6bbf;
          }
          local_e8 = local_e8 & 0xffffffff;
          local_dc = local_dc + 1;
          uVar6 = 0;
          while (uVar1 = local_e8, uVar6 = uVar6 + 1, uVar6 < local_c4) {
            uVar2 = 0;
            iVar4 = EVP_DigestInit_ex((EVP_MD_CTX *)&c,local_b0,(ENGINE *)0x0);
            if (((iVar4 == 0) ||
                (iVar4 = EVP_DigestUpdate((EVP_MD_CTX *)&c,md_buf,(ulong)mds), iVar4 == 0)) ||
               (iVar4 = EVP_DigestFinal_ex((EVP_MD_CTX *)&c,md_buf,&mds), iVar4 == 0))
            goto LAB_001f6bbf;
          }
          if (local_e8 == 0) {
            uVar5 = 0;
            local_e8 = 0;
          }
          else {
            uVar5 = 0;
            do {
              if (uVar5 == mds) {
                local_e8 = (ulong)(uint)((int)local_e8 - (int)uVar5);
                goto LAB_001f6b5d;
              }
              if (local_d0 == (uint8_t *)0x0) {
                local_d0 = (uint8_t *)0x0;
              }
              else {
                *local_d0 = md_buf[uVar5];
                local_d0 = local_d0 + 1;
              }
              uVar5 = uVar5 + 1;
            } while ((int)local_e8 != (int)uVar5);
            local_e8 = 0;
            uVar5 = uVar1;
          }
LAB_001f6b5d:
          uVar2 = 0;
          if ((uVar3 != 0) && (uVar2 = uVar3, (uint)uVar5 != mds)) {
            do {
              uVar2 = uVar3;
              if ((uint)uVar5 == mds) break;
              if (local_d8 == (uint8_t *)0x0) {
                local_d8 = (uint8_t *)0x0;
              }
              else {
                *local_d8 = md_buf[uVar5 & 0xffffffff];
                local_d8 = local_d8 + 1;
              }
              uVar5 = (ulong)((uint)uVar5 + 1);
              uVar3 = uVar3 - 1;
              uVar2 = 0;
            } while (uVar3 != 0);
          }
          uVar3 = uVar2;
        } while ((int)local_e8 != 0 || uVar3 != 0);
        uVar2 = EVP_CIPHER_key_length(local_a8);
LAB_001f6bbf:
        OPENSSL_cleanse(md_buf,0x40);
        EVP_MD_CTX_cleanup((EVP_MD_CTX *)&c);
      }
      return uVar2;
    }
    __assertion = "niv <= EVP_MAX_IV_LENGTH";
    uVar2 = 0x25;
  }
  else {
    __assertion = "nkey <= EVP_MAX_KEY_LENGTH";
    uVar2 = 0x24;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/derive_key.cc"
                ,uVar2,
                "int EVP_BytesToKey(const EVP_CIPHER *, const EVP_MD *, const uint8_t *, const uint8_t *, size_t, unsigned int, uint8_t *, uint8_t *)"
               );
}

Assistant:

int EVP_BytesToKey(const EVP_CIPHER *type, const EVP_MD *md,
                   const uint8_t *salt, const uint8_t *data, size_t data_len,
                   unsigned count, uint8_t *key, uint8_t *iv) {
  uint8_t md_buf[EVP_MAX_MD_SIZE];
  unsigned addmd = 0;
  unsigned mds = 0, i;
  int rv = 0;

  unsigned nkey = EVP_CIPHER_key_length(type);
  unsigned niv = EVP_CIPHER_iv_length(type);

  assert(nkey <= EVP_MAX_KEY_LENGTH);
  assert(niv <= EVP_MAX_IV_LENGTH);

  if (data == nullptr) {
    return nkey;
  }

  bssl::ScopedEVP_MD_CTX c;
  for (;;) {
    if (!EVP_DigestInit_ex(c.get(), md, nullptr)) {
      goto err;
    }
    if (addmd++) {
      if (!EVP_DigestUpdate(c.get(), md_buf, mds)) {
        goto err;
      }
    }
    if (!EVP_DigestUpdate(c.get(), data, data_len)) {
      goto err;
    }
    if (salt != nullptr) {
      if (!EVP_DigestUpdate(c.get(), salt, PKCS5_SALT_LEN)) {
        goto err;
      }
    }
    if (!EVP_DigestFinal_ex(c.get(), md_buf, &mds)) {
      goto err;
    }

    for (i = 1; i < count; i++) {
      if (!EVP_DigestInit_ex(c.get(), md, nullptr) ||
          !EVP_DigestUpdate(c.get(), md_buf, mds) ||
          !EVP_DigestFinal_ex(c.get(), md_buf, &mds)) {
        goto err;
      }
    }

    i = 0;
    if (nkey) {
      for (;;) {
        if (nkey == 0 || i == mds) {
          break;
        }
        if (key != nullptr) {
          *(key++) = md_buf[i];
        }
        nkey--;
        i++;
      }
    }

    if (niv && i != mds) {
      for (;;) {
        if (niv == 0 || i == mds) {
          break;
        }
        if (iv != nullptr) {
          *(iv++) = md_buf[i];
        }
        niv--;
        i++;
      }
    }
    if (nkey == 0 && niv == 0) {
      break;
    }
  }
  rv = EVP_CIPHER_key_length(type);

err:
  OPENSSL_cleanse(md_buf, EVP_MAX_MD_SIZE);
  return rv;
}